

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipc_listener.cpp
# Opt level: O2

int __thiscall zmq::ipc_listener_t::close(ipc_listener_t *this,int __fd)

{
  socket_base_t *psVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  char *errmsg_;
  endpoint_uri_pair_t local_70;
  
  iVar3 = (this->super_stream_listener_base_t)._s;
  if (iVar3 == -1) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","_s != retired_fd",
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/ipc_listener.cpp"
            ,0xbf);
    fflush(_stderr);
    zmq_abort("_s != retired_fd");
    iVar3 = (this->super_stream_listener_base_t)._s;
  }
  iVar2 = ::close(iVar3);
  if (iVar2 != 0) {
    piVar4 = __errno_location();
    errmsg_ = strerror(*piVar4);
    fprintf(_stderr,"%s (%s:%d)\n",errmsg_,
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/ipc_listener.cpp"
            ,0xc6);
    fflush(_stderr);
    zmq_abort(errmsg_);
  }
  (this->super_stream_listener_base_t)._s = -1;
  if ((this->_has_file == true) &&
     ((this->super_stream_listener_base_t).super_own_t.options.use_fd == -1)) {
    if ((this->_tmp_socket_dirname)._M_string_length == 0) {
LAB_001737fa:
      if (iVar2 == 0) goto LAB_0017383d;
    }
    else {
      iVar2 = unlink((this->_filename)._M_dataplus._M_p);
      if (iVar2 == 0) {
        iVar2 = rmdir((this->_tmp_socket_dirname)._M_dataplus._M_p);
        (this->_tmp_socket_dirname)._M_string_length = 0;
        *(this->_tmp_socket_dirname)._M_dataplus._M_p = '\0';
        goto LAB_001737fa;
      }
    }
    psVar1 = (this->super_stream_listener_base_t)._socket;
    make_unconnected_bind_endpoint_pair(&local_70,&(this->super_stream_listener_base_t)._endpoint);
    iVar3 = zmq_errno();
    socket_base_t::event_close_failed(psVar1,&local_70,iVar3);
    endpoint_uri_pair_t::~endpoint_uri_pair_t(&local_70);
    iVar3 = -1;
  }
  else {
LAB_0017383d:
    psVar1 = (this->super_stream_listener_base_t)._socket;
    make_unconnected_bind_endpoint_pair(&local_70,&(this->super_stream_listener_base_t)._endpoint);
    socket_base_t::event_closed(psVar1,&local_70,iVar3);
    endpoint_uri_pair_t::~endpoint_uri_pair_t(&local_70);
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int zmq::ipc_listener_t::close ()
{
    zmq_assert (_s != retired_fd);
    const fd_t fd_for_event = _s;
#ifdef ZMQ_HAVE_WINDOWS
    int rc = closesocket (_s);
    wsa_assert (rc != SOCKET_ERROR);
#else
    int rc = ::close (_s);
    errno_assert (rc == 0);
#endif

    _s = retired_fd;

    if (_has_file && options.use_fd == -1) {
        if (!_tmp_socket_dirname.empty ()) {
            //  TODO review this behaviour, it is inconsistent with the use of
            //  unlink in open since 656cdb959a7482c45db979c1d08ede585d12e315;
            //  however, we must at least remove the file before removing the
            //  directory, otherwise it will always fail
            rc = ::unlink (_filename.c_str ());

            if (rc == 0) {
                rc = ::rmdir (_tmp_socket_dirname.c_str ());
                _tmp_socket_dirname.clear ();
            }
        }

        if (rc != 0) {
            _socket->event_close_failed (
              make_unconnected_bind_endpoint_pair (_endpoint), zmq_errno ());
            return -1;
        }
    }

    _socket->event_closed (make_unconnected_bind_endpoint_pair (_endpoint),
                           fd_for_event);
    return 0;
}